

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

int lj_cf_jit_status(lua_State *L)

{
  uint uVar1;
  long lVar2;
  char *in_RDI;
  uint32_t unaff_retaddr;
  uint32_t unaff_retaddr_00;
  jit_State *J;
  
  *(undefined8 *)(in_RDI + 0x18) = *(undefined8 *)(in_RDI + 0x10);
  uVar1 = *(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x2d8);
  lVar2 = *(long *)(in_RDI + 0x18);
  *(long *)(in_RDI + 0x18) = lVar2 + 8;
  *(uint *)(lVar2 + 4) = -2 - (uint)((uVar1 & 1) != 0);
  flagbits_to_strings((lua_State *)J,unaff_retaddr_00,unaff_retaddr,in_RDI);
  flagbits_to_strings((lua_State *)J,unaff_retaddr_00,unaff_retaddr,in_RDI);
  return (int)(*(long *)(in_RDI + 0x18) - *(long *)(in_RDI + 0x10) >> 3);
}

Assistant:

LJLIB_CF(jit_status)
{
#if LJ_HASJIT
  jit_State *J = L2J(L);
  L->top = L->base;
  setboolV(L->top++, (J->flags & JIT_F_ON) ? 1 : 0);
  flagbits_to_strings(L, J->flags, JIT_F_CPU, JIT_F_CPUSTRING);
  flagbits_to_strings(L, J->flags, JIT_F_OPT, JIT_F_OPTSTRING);
  return (int)(L->top - L->base);
#else
  setboolV(L->top++, 0);
  return 1;
#endif
}